

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O0

int Bal_ManDeriveCuts(Bal_Man_t *p,int iFan0,int iFan1,int iFan2,int fCompl0,int fCompl1,int fCompl2
                     ,int fUnit0,int fUnit1,int fUnit2,int fIsXor,int Target,int fSave)

{
  int iVar1;
  int iVar2;
  Bal_Cut_t *pBVar3;
  Bal_Cut_t *pBVar4;
  Bal_Cut_t *pBVar5;
  Bal_Cut_t *pCut2Lim;
  Bal_Cut_t *pCut2;
  int nCuts2;
  int nCutsR;
  int Cost;
  int i;
  Bal_Cut_t *pCut1Lim;
  Bal_Cut_t *pCut1;
  Bal_Cut_t *pCut0Lim;
  Bal_Cut_t *pCut0;
  int nCuts1;
  int nCuts0;
  Bal_Cut_t *pCutSet2;
  Bal_Cut_t *pCutSet1;
  Bal_Cut_t *pCutSet0;
  Bal_Cut_t *pCutsR [8];
  Bal_Cut_t pCutSet [8];
  int fCompl1_local;
  int fCompl0_local;
  int iFan2_local;
  int iFan1_local;
  int iFan0_local;
  Bal_Man_t *p_local;
  
  iVar1 = Bal_ManPrepareSet(p,iFan0,0,fUnit0,&pCutSet1);
  iVar2 = Bal_ManPrepareSet(p,iFan1,1,fUnit1,&pCutSet2);
  pBVar3 = pCutSet1 + iVar1;
  pBVar4 = pCutSet2 + iVar2;
  pCut2._4_4_ = 0;
  memset(pCutsR + 7,0,(long)p->nCutNum * 0x28);
  for (nCutsR = 0; nCutsR < p->nCutNum; nCutsR = nCutsR + 1) {
    pCutsR[(long)nCutsR + -1] = (Bal_Cut_t *)(pCutSet[(long)nCutsR + -1].pLeaves + 4);
  }
  if (iFan2 < 1) {
    for (pCut0Lim = pCutSet1; pCut0Lim < pBVar3; pCut0Lim = pCut0Lim + 1) {
      for (pCut1Lim = pCutSet2; pCut1Lim < pBVar4; pCut1Lim = pCut1Lim + 1) {
        iVar1 = Bal_CutCountBits(pCut0Lim->Sign | pCut1Lim->Sign);
        if ((iVar1 <= p->nLutSize) &&
           (iVar1 = Bal_CutMergeOrder(pCut0Lim,pCut1Lim,pCutsR[(long)pCut2._4_4_ + -1],p->nLutSize),
           iVar1 != 0)) {
          if (pCutsR[(long)pCut2._4_4_ + -1]->Delay != Target) {
            __assert_fail("pCutsR[nCutsR]->Delay == Target",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                          ,0x1bc,
                          "int Bal_ManDeriveCuts(Bal_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int)"
                         );
          }
          iVar1 = Bal_SetLastCutIsContained(&pCutSet0,pCut2._4_4_);
          if (iVar1 == 0) {
            pCut2._4_4_ = Bal_SetAddCut(&pCutSet0,pCut2._4_4_,p->nCutNum);
          }
        }
      }
    }
  }
  else {
    iVar1 = Bal_ManPrepareSet(p,iFan2,2,fUnit2,(Bal_Cut_t **)&nCuts1);
    pBVar5 = _nCuts1 + iVar1;
    for (pCut0Lim = pCutSet1; pCut0Lim < pBVar3; pCut0Lim = pCut0Lim + 1) {
      for (pCut1Lim = pCutSet2; pCut1Lim < pBVar4; pCut1Lim = pCut1Lim + 1) {
        for (pCut2Lim = _nCuts1; pCut2Lim < pBVar5; pCut2Lim = pCut2Lim + 1) {
          iVar1 = Bal_CutCountBits(pCut0Lim->Sign | pCut1Lim->Sign | pCut2Lim->Sign);
          if ((iVar1 <= p->nLutSize) &&
             (iVar1 = Bal_CutMergeOrderMux
                                (pCut0Lim,pCut1Lim,pCut2Lim,pCutsR[(long)pCut2._4_4_ + -1],
                                 p->nLutSize), iVar1 != 0)) {
            if (pCutsR[(long)pCut2._4_4_ + -1]->Delay != Target) {
              __assert_fail("pCutsR[nCutsR]->Delay == Target",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                            ,0x1ab,
                            "int Bal_ManDeriveCuts(Bal_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int)"
                           );
            }
            iVar1 = Bal_SetLastCutIsContained(&pCutSet0,pCut2._4_4_);
            if (iVar1 == 0) {
              pCut2._4_4_ = Bal_SetAddCut(&pCutSet0,pCut2._4_4_,p->nCutNum);
            }
          }
        }
      }
    }
  }
  if (pCut2._4_4_ == 0) {
    p_local._4_4_ = 0xffffffff;
  }
  else {
    p_local._4_4_ = pCutSet0->Delay << 4 | *(uint *)&pCutSet0->field_0xc >> 0x1b;
    if ((pCut2._4_4_ < 1) || (p->nCutNum <= pCut2._4_4_)) {
      __assert_fail("nCutsR > 0 && nCutsR < p->nCutNum",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                    ,0x1c9,
                    "int Bal_ManDeriveCuts(Bal_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int)"
                   );
    }
    iVar1 = Bal_SetCheckArray(&pCutSet0,pCut2._4_4_);
    if (iVar1 == 0) {
      __assert_fail("Bal_SetCheckArray(pCutsR, nCutsR)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                    ,0x1ca,
                    "int Bal_ManDeriveCuts(Bal_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int)"
                   );
    }
    if ((fSave != 0) && (-1 < (int)p_local._4_4_)) {
      pCutSet1 = (Bal_Cut_t *)calloc((long)p->nCutNum,0x28);
      Vec_PtrPush(p->vCutSets,pCutSet1);
      iVar1 = Vec_PtrSize(p->vCutSets);
      iVar2 = Gia_ManObjNum(p->pNew);
      if (iVar1 != iVar2) {
        __assert_fail("Vec_PtrSize(p->vCutSets) == Gia_ManObjNum(p->pNew)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                      ,0x1d0,
                      "int Bal_ManDeriveCuts(Bal_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int)"
                     );
      }
      for (nCutsR = 0; nCutsR < pCut2._4_4_; nCutsR = nCutsR + 1) {
        memcpy(pCutSet1 + nCutsR,pCutsR[(long)nCutsR + -1],0x28);
      }
      for (; nCutsR < p->nCutNum; nCutsR = nCutsR + 1) {
        *(uint *)&pCutSet1[nCutsR].field_0xc =
             *(uint *)&pCutSet1[nCutsR].field_0xc & 0x7ffffff | 0xf8000000;
      }
      Vec_IntPush(p->vCosts,p_local._4_4_);
      iVar1 = Vec_IntSize(p->vCosts);
      iVar2 = Gia_ManObjNum(p->pNew);
      if (iVar1 != iVar2) {
        __assert_fail("Vec_IntSize(p->vCosts) == Gia_ManObjNum(p->pNew)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                      ,0x1d6,
                      "int Bal_ManDeriveCuts(Bal_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int)"
                     );
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Bal_ManDeriveCuts( Bal_Man_t * p, int iFan0, int iFan1, int iFan2, int fCompl0, int fCompl1, int fCompl2, int fUnit0, int fUnit1, int fUnit2, int fIsXor, int Target, int fSave )
{
    Bal_Cut_t pCutSet[BAL_CUT_MAX], * pCutsR[BAL_CUT_MAX];
    Bal_Cut_t * pCutSet0, * pCutSet1, * pCutSet2;
    int nCuts0 = Bal_ManPrepareSet( p, iFan0, 0, fUnit0, &pCutSet0 );
    int nCuts1 = Bal_ManPrepareSet( p, iFan1, 1, fUnit1, &pCutSet1 );
    Bal_Cut_t * pCut0, * pCut0Lim = pCutSet0 + nCuts0;
    Bal_Cut_t * pCut1, * pCut1Lim = pCutSet1 + nCuts1;
    int i, Cost, nCutsR = 0;
    memset( pCutSet, 0, sizeof(Bal_Cut_t) * p->nCutNum );
    for ( i = 0; i < p->nCutNum; i++ )
        pCutsR[i] = pCutSet + i;
    // enumerate cuts
    if ( iFan2 > 0 )
    {
        int nCuts2 = Bal_ManPrepareSet( p, iFan2, 2, fUnit2, &pCutSet2 );
        Bal_Cut_t * pCut2, * pCut2Lim = pCutSet2 + nCuts2;
        for ( pCut0 = pCutSet0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCutSet1; pCut1 < pCut1Lim; pCut1++ )
        for ( pCut2 = pCutSet2; pCut2 < pCut2Lim; pCut2++ )
        {
            if ( Bal_CutCountBits(pCut0->Sign | pCut1->Sign | pCut2->Sign) > p->nLutSize )
                continue;
            if ( !Bal_CutMergeOrderMux(pCut0, pCut1, pCut2, pCutsR[nCutsR], p->nLutSize) )
                continue;
            assert( pCutsR[nCutsR]->Delay == Target );
            if ( Bal_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
//            if ( p->fCutMin && Bal_CutComputeTruthMux(p, pCut0, pCut1, pCut2, fCompl0, fCompl1, fCompl2, pCutsR[nCutsR]) )
//                pCutsR[nCutsR]->Sign = Bal_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            nCutsR = Bal_SetAddCut( pCutsR, nCutsR, p->nCutNum );
        }
    }
    else
    {
        for ( pCut0 = pCutSet0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCutSet1; pCut1 < pCut1Lim; pCut1++ )
        {
            if ( Bal_CutCountBits(pCut0->Sign | pCut1->Sign) > p->nLutSize )
                continue;
            if ( !Bal_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], p->nLutSize) )
                continue;
            assert( pCutsR[nCutsR]->Delay == Target );
            if ( Bal_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
//            if ( p->fCutMin && Bal_CutComputeTruth(p, pCut0, pCut1, fCompl0, fCompl1, pCutsR[nCutsR], fIsXor) )
//                pCutsR[nCutsR]->Sign = Bal_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            nCutsR = Bal_SetAddCut( pCutsR, nCutsR, p->nCutNum );
        }
    }
    if ( nCutsR == 0 )
        return -1;
//printf( "%d ", nCutsR );
    Cost = ((pCutsR[0]->Delay << 4) | pCutsR[0]->nLeaves);
    // verify
    assert( nCutsR > 0 && nCutsR < p->nCutNum );
    assert( Bal_SetCheckArray(pCutsR, nCutsR) );
    // save cuts
    if ( fSave && Cost >= 0 )
    {
        pCutSet0 = ABC_CALLOC( Bal_Cut_t, p->nCutNum );
        Vec_PtrPush( p->vCutSets, pCutSet0 );
        assert( Vec_PtrSize(p->vCutSets) == Gia_ManObjNum(p->pNew) );
        for ( i = 0; i < nCutsR; i++ )
            pCutSet0[i] = *pCutsR[i];        
        for ( ; i < p->nCutNum; i++ )
            pCutSet0[i].nLeaves = BAL_NO_LEAF;
        Vec_IntPush( p->vCosts, Cost );
        assert( Vec_IntSize(p->vCosts) == Gia_ManObjNum(p->pNew) );
    }
    return Cost;
}